

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::
_preBegin__profile_GLES2__technique__pass__states__stencil_mask
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *additionalText;
  bool bVar1;
  bool bVar2;
  undefined8 in_RAX;
  sint64 *psVar3;
  StringHash SVar4;
  sint64 sVar5;
  int iVar6;
  bool bVar7;
  xmlChar **ppxVar8;
  bool failed;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  psVar3 = (sint64 *)
           GeneratedSaxParser::StackMemoryManager::newObject
                     (&(this->
                       super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                       ).super_ParserTemplateBase.mStackMemoryManager,0x10);
  *psVar3 = 0xffffffff;
  psVar3[1] = 0;
  *attributeDataPtr = psVar3;
  ppxVar8 = attributes->attributes;
  bVar7 = true;
  if (ppxVar8 != (xmlChar **)0x0) {
    do {
      text = *ppxVar8;
      if (text == (ParserChar *)0x0) {
        iVar6 = 3;
      }
      else {
        SVar4 = GeneratedSaxParser::Utils::calculateStringHash(text);
        additionalText = ppxVar8[1];
        ppxVar8 = ppxVar8 + 2;
        if (SVar4 == 0x76887d) {
          psVar3[1] = (sint64)additionalText;
        }
        else if (SVar4 == 0x7c83b5) {
          sVar5 = GeneratedSaxParser::Utils::toSint64(additionalText,(bool *)((long)&uStack_38 + 7))
          ;
          *psVar3 = sVar5;
          if (uStack_38._7_1_ == '\x01') {
            bVar2 = false;
            bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                               ERROR_ATTRIBUTE_PARSING_FAILED,0x9d0fc0b,0x7c83b5,additionalText);
            if (!bVar1) goto LAB_0072e080;
            iVar6 = 1;
          }
          else {
LAB_0072e080:
            iVar6 = 4;
            bVar2 = true;
          }
          if (!bVar2) goto LAB_0072e08f;
        }
        else {
          bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_UNKNOWN_ATTRIBUTE,0x9d0fc0b,text,additionalText);
          iVar6 = 1;
          if (bVar2) goto LAB_0072e08f;
        }
        iVar6 = 0;
      }
LAB_0072e08f:
    } while (iVar6 == 0);
    if (iVar6 != 3) {
      bVar7 = false;
    }
  }
  return bVar7;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__profile_GLES2__technique__pass__states__stencil_mask( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__profile_GLES2__technique__pass__states__stencil_mask( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

profile_GLES2__technique__pass__states__stencil_mask__AttributeData* attributeData = newData<profile_GLES2__technique__pass__states__stencil_mask__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_VALUE:
    {
bool failed;
attributeData->value = GeneratedSaxParser::Utils::toSint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_STENCIL_MASK,
        HASH_ATTRIBUTE_VALUE,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_PARAM:
    {

attributeData->param = attributeValue;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_STENCIL_MASK, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}